

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

bool __thiscall File::save(File *this,string *fileName)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  pointer ppTVar4;
  ulong uVar5;
  ulong uVar6;
  stringstream stream;
  ofstream file;
  long *local_3c8;
  long local_3c0;
  long local_3b8 [2];
  stringstream local_3a8 [128];
  ios_base local_328 [264];
  long local_220;
  filebuf local_218 [24];
  uint auStack_200 [54];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220,(fileName->_M_dataplus)._M_p,_S_out);
  uVar1 = *(uint *)((long)auStack_200 + *(long *)(local_220 + -0x18));
  if ((uVar1 & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: Can\'t create file \"",0x1a);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(fileName->_M_dataplus)._M_p,
                        fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"!",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::__cxx11::stringstream::stringstream(local_3a8);
  ppTVar4 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      (**(ppTVar4[uVar5]->super_StreamObject)._vptr_StreamObject)(ppTVar4[uVar5],local_3a8);
      ppTVar4 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)(this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4 >> 3);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,(char *)local_3c8,local_3c0);
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8,local_3b8[0] + 1);
  }
  std::ofstream::close();
  std::__cxx11::stringstream::~stringstream(local_3a8);
  std::ios_base::~ios_base(local_328);
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return (uVar1 & 5) == 0;
}

Assistant:

bool File::save( std::string fileName )
{
	bool success = true;

	std::ofstream file( fileName.c_str() );

	if ( !file )
	{
                std::cerr << "Error: Can't create file \"" << fileName << "\"!" << std::endl;
		success = false;
	}

	std::stringstream stream;

	for ( unsigned int i = 0; i < elements().size(); i++ )
	{
		elements()[i]->write( stream );
	}

	file << stream.str();

	file.close();

	return success;
}